

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

int64_t cab_minimum_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  short *psVar1;
  undefined1 uVar2;
  ushort uVar3;
  void *pvVar4;
  int *piVar5;
  uint *puVar6;
  uint32_t uVar7;
  undefined8 in_RAX;
  long lVar8;
  ulong uVar9;
  uint32_t sum;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  cfdata *cfdata;
  undefined1 *puVar13;
  size_t bytes;
  uint uVar14;
  ulong request;
  bool bVar15;
  undefined4 uVar16;
  
  uVar16 = (undefined4)((ulong)in_RAX >> 0x20);
  pvVar4 = a->format->data;
  piVar5 = *(int **)((long)pvVar4 + 0x38);
  if (*(short *)(*(long *)((long)pvVar4 + 0x28) + 6) == 0) {
    uVar9 = *(ulong *)(piVar5 + 4);
    request = consumed_bytes;
    if ((long)uVar9 < consumed_bytes) {
      request = uVar9;
    }
    *(short *)((long)piVar5 + 0xe) = *(short *)((long)piVar5 + 0xe) + (short)request;
    *(short *)((long)piVar5 + 10) = *(short *)((long)piVar5 + 10) - (short)request;
    consumed_bytes = consumed_bytes - request;
    *(ulong *)(piVar5 + 4) = uVar9 - request;
    if (request == 0) {
      return consumed_bytes;
    }
  }
  else {
    uVar3 = *(ushort *)((long)piVar5 + 0xe);
    lVar8 = (ulong)*(ushort *)(piVar5 + 3) - (ulong)uVar3;
    if (lVar8 != 0 && (ulong)uVar3 <= (ulong)*(ushort *)(piVar5 + 3)) {
      if (consumed_bytes <= lVar8) {
        lVar8 = consumed_bytes;
      }
      consumed_bytes = consumed_bytes - lVar8;
      *(ushort *)((long)piVar5 + 0xe) = uVar3 + (short)lVar8;
      *(short *)((long)piVar5 + 10) = *(short *)((long)piVar5 + 10) - (short)lVar8;
    }
    request = *(ulong *)(piVar5 + 4);
    if (request == 0) {
      return consumed_bytes;
    }
    piVar5[4] = 0;
    piVar5[5] = 0;
  }
  if ((*piVar5 == 0) || (puVar13 = *(undefined1 **)(piVar5 + 0xe), puVar13 == (undefined1 *)0x0))
  goto LAB_001ff4c7;
  iVar10 = piVar5[0xc];
  uVar9 = request;
  if (iVar10 == 0) {
LAB_001ff479:
    uVar14 = (uint)uVar9 & 3;
    if ((uVar9 & 0xfffffffffffffffc) != 0) {
      uVar11 = piVar5[10];
      if ((int)(uVar9 & 0xfffffffffffffffc) != 0) {
        lVar8 = 0;
        do {
          uVar11 = uVar11 ^ *(uint *)(puVar13 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (((uint)(uVar9 >> 2) & 0x3fffffff) != (uint)lVar8);
      }
      piVar5[10] = uVar11;
    }
    if ((uVar9 & 3) != 0) {
      memcpy(piVar5 + 0xb,puVar13 + (uVar9 - uVar14),(ulong)uVar14);
    }
    piVar5[0xc] = uVar14;
  }
  else {
    uVar12 = request;
    if (iVar10 < 4) {
      do {
        uVar2 = *puVar13;
        puVar13 = puVar13 + 1;
        piVar5[0xc] = iVar10 + 1;
        *(undefined1 *)((long)piVar5 + (long)iVar10 + 0x2c) = uVar2;
        uVar9 = uVar12 - 1;
        iVar10 = piVar5[0xc];
        if (3 < iVar10) break;
        bVar15 = uVar12 != 1;
        uVar12 = uVar9;
      } while (bVar15);
    }
    if (iVar10 == 4) {
      piVar5[10] = piVar5[10] ^ piVar5[0xb];
      piVar5[0xc] = 0;
    }
    if (uVar9 != 0) goto LAB_001ff479;
  }
  piVar5[0xe] = 0;
  piVar5[0xf] = 0;
LAB_001ff4c7:
  __archive_read_consume(a,request);
  *(long *)((long)pvVar4 + 0x40) = *(long *)((long)pvVar4 + 0x40) + request;
  psVar1 = (short *)((long)piVar5 + 6);
  *psVar1 = *psVar1 - (short)request;
  if (*psVar1 == 0) {
    pvVar4 = a->format->data;
    puVar6 = *(uint **)((long)pvVar4 + 0x38);
    uVar14 = *puVar6;
    if (uVar14 != 0) {
      if ((long)(int)puVar6[0xc] != 0) {
        uVar7 = cab_checksum_cfdata(puVar6 + 0xb,(long)(int)puVar6[0xc],puVar6[10]);
        puVar6[10] = uVar7;
        puVar6[0xc] = 0;
      }
      bytes = 4;
      if ((*(byte *)((long)pvVar4 + 0x54) & 4) != 0) {
        bytes = (ulong)*(byte *)((long)pvVar4 + 0x5d) + 4;
      }
      uVar7 = cab_checksum_cfdata((void *)(*(long *)(puVar6 + 8) + 4),bytes,puVar6[10]);
      puVar6[10] = uVar7;
      if (uVar7 != uVar14) {
        archive_set_error(&a->archive,0x54,"Checksum error CFDATA[%d] %x:%x in %d bytes",
                          (ulong)(*(int *)(*(long *)((long)pvVar4 + 0x28) + 0x58) - 1),(ulong)uVar14
                          ,(ulong)uVar7,CONCAT44(uVar16,(uint)(ushort)puVar6[1]));
        consumed_bytes = -0x19;
      }
    }
  }
  return consumed_bytes;
}

Assistant:

static int64_t
cab_minimum_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	cfdata = cab->entry_cfdata;
	rbytes = consumed_bytes;
	if (cab->entry_cffolder->comptype == COMPTYPE_NONE) {
		if (consumed_bytes < cfdata->unconsumed)
			cbytes = consumed_bytes;
		else
			cbytes = cfdata->unconsumed;
		rbytes -= cbytes; 
		cfdata->read_offset += (uint16_t)cbytes;
		cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		cfdata->unconsumed -= cbytes;
	} else {
		cbytes = cfdata->uncompressed_avail - cfdata->read_offset;
		if (cbytes > 0) {
			if (consumed_bytes < cbytes)
				cbytes = consumed_bytes;
			rbytes -= cbytes;
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		}

		if (cfdata->unconsumed) {
			cbytes = cfdata->unconsumed;
			cfdata->unconsumed = 0;
		} else
			cbytes = 0;
	}
	if (cbytes) {
		/* Compute the sum. */
		cab_checksum_update(a, (size_t)cbytes);

		/* Consume as much as the compressor actually used. */
		__archive_read_consume(a, cbytes);
		cab->cab_offset += cbytes;
		cfdata->compressed_bytes_remaining -= (uint16_t)cbytes;
		if (cfdata->compressed_bytes_remaining == 0) {
			err = cab_checksum_finish(a);
			if (err < 0)
				return (err);
		}
	}
	return (rbytes);
}